

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O2

econf_file * init_key_file(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *param;
  econf_file *key_file;
  
  key_file = (econf_file *)0x0;
  param = (char *)0x0;
  iVar1 = asprintf(&param,"PARSING_DIRS=%s:%s",usr_root_dir,root_dir);
  if (iVar1 < 0) {
    fwrite("Out of memory!\n",0xf,1,_stderr);
  }
  else {
    iVar1 = econf_newKeyFile_with_options(&key_file,param);
    __stream = _stderr;
    if (iVar1 == 0) {
      free(param);
      return key_file;
    }
    uVar2 = econf_errString(iVar1);
    fprintf(__stream,"ERROR: couldn\'t allocate new key_file: %s\n",uVar2);
    free(param);
  }
  exit(1);
}

Assistant:

static econf_file *init_key_file(void)
{
    econf_file *key_file = NULL;
    econf_err error;

    char *param = NULL;
    if (asprintf(&param, "PARSING_DIRS=%s:%s", usr_root_dir, root_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
    }

    if ((error = econf_newKeyFile_with_options(&key_file, param)))
    {
      fprintf (stderr, "ERROR: couldn't allocate new key_file: %s\n",
	       econf_errString(error));
      free(param);
      exit(EXIT_FAILURE);
    }

    free(param);
    return key_file;
}